

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu34x.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu34x_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MppDev ctx;
  long local_68;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_S32 index;
  MppDev dev;
  Vdpu34xVp9dRegSet *hw_regs;
  Vdpu34xVp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x40);
  dev = *(MppDev *)(lVar1 + 0xe8);
  ctx = *(MppDev *)((long)hal + 0x10);
  if (*(int *)((long)hal + 0x38) != 0) {
    dev = *(MppDev *)(lVar1 + (long)(task->dec).reg_index * 0x40 + 0x30);
  }
  if ((dev == (MppDev)0x0) &&
     (_mpp_log_l(2,"hal_vp9d_vdpu34x","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_vdpu34x_start",0x361), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  rd_cfg._8_8_ = dev;
  p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
  if (p_hal._4_4_ == MPP_OK) {
    rd_cfg._8_8_ = (long)dev + 100;
    p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
    if (p_hal._4_4_ == MPP_OK) {
      rd_cfg._8_8_ = (long)dev + 0x128;
      p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
      if (p_hal._4_4_ == MPP_OK) {
        rd_cfg._8_8_ = (long)dev + 0x164;
        p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
        if (p_hal._4_4_ == MPP_OK) {
          rd_cfg._8_8_ = (long)dev + 0x234;
          p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
          if (p_hal._4_4_ == MPP_OK) {
            local_68 = (long)dev + 0x1fc;
            rd_cfg.reg._0_4_ = 0x38;
            rd_cfg.reg._4_4_ = 0x380;
            p_hal._4_4_ = mpp_dev_ioctl(ctx,5,&local_68);
            if (p_hal._4_4_ == MPP_OK) {
              vdpu34x_set_rcbinfo(ctx,(Vdpu34xRcbInfo *)(lVar1 + 0x16c));
              p_hal._4_4_ = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
              if (p_hal._4_4_ != MPP_OK) {
                _mpp_log_l(2,"hal_vp9d_vdpu34x","send cmd failed %d\n","hal_vp9d_vdpu34x_start",
                           (ulong)(uint)p_hal._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"hal_vp9d_vdpu34x","set register read failed %d\n",
                         "hal_vp9d_vdpu34x_start",(ulong)(uint)p_hal._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_vp9d_vdpu34x","set register write failed %d\n",
                       "hal_vp9d_vdpu34x_start",(ulong)(uint)p_hal._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_vp9d_vdpu34x","set register write failed %d\n","hal_vp9d_vdpu34x_start",
                     (ulong)(uint)p_hal._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_vp9d_vdpu34x","set register write failed %d\n","hal_vp9d_vdpu34x_start",
                   (ulong)(uint)p_hal._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_vp9d_vdpu34x","set register write failed %d\n","hal_vp9d_vdpu34x_start",
                 (ulong)(uint)p_hal._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp9d_vdpu34x","set register write failed %d\n","hal_vp9d_vdpu34x_start",
               (ulong)(uint)p_hal._4_4_);
  }
  return p_hal._4_4_;
}

Assistant:

static MPP_RET hal_vp9d_vdpu34x_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu34xVp9dCtx *hw_ctx = (Vdpu34xVp9dCtx*)p_hal->hw_ctx;
    Vdpu34xVp9dRegSet *hw_regs = (Vdpu34xVp9dRegSet *)hw_ctx->hw_regs;
    MppDev dev = p_hal->dev;

    if (p_hal->fast_mode) {
        RK_S32 index =  task->dec.reg_index;
        hw_regs = (Vdpu34xVp9dRegSet *)hw_ctx->g_buf[index].hw_regs;
    }

    mpp_assert(hw_regs);


#if VP9_DUMP
    {
        static RK_U32 file_cnt = 0;
        char file_name[128];
        sprintf(file_name, "/data/vp9_regs/reg_%d.txt", file_cnt);
        FILE *fp = fopen(file_name, "wb");
        RK_U32 i = 0;
        RK_U32 *tmp = NULL;
        tmp = (RK_U32 *)&hw_regs->common;
        for (i = 0; i < sizeof(hw_regs->common) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 8, tmp[i]);
        }
        fprintf(fp, "\n");
        tmp = (RK_U32 *)&hw_regs->vp9d_param;
        for (i = 0; i < sizeof(hw_regs->vp9d_param) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 64, tmp[i]);
        }
        fprintf(fp, "\n");
        tmp = (RK_U32 *)&hw_regs->common_addr;
        for (i = 0; i < sizeof(hw_regs->common_addr) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 128, tmp[i]);
        }
        fprintf(fp, "\n");
        tmp = (RK_U32 *)&hw_regs->vp9d_addr;
        for (i = 0; i < sizeof(hw_regs->vp9d_addr) / 4; i++) {
            fprintf(fp, "reg[%d] 0x%08x\n", i + 160, tmp[i]);
        }
        file_cnt++;
        fflush(fp);
        fclose(fp);
    }
#endif

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &hw_regs->common;
        wr_cfg.size = sizeof(hw_regs->common);
        wr_cfg.offset = OFFSET_COMMON_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_param;
        wr_cfg.size = sizeof(hw_regs->vp9d_param);
        wr_cfg.offset = OFFSET_CODEC_PARAMS_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->common_addr;
        wr_cfg.size = sizeof(hw_regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_addr;
        wr_cfg.size = sizeof(hw_regs->vp9d_addr);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->statistic;
        wr_cfg.size = sizeof(hw_regs->statistic);
        wr_cfg.offset = OFFSET_STATISTIC_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &hw_regs->irq_status;
        rd_cfg.size = sizeof(hw_regs->irq_status);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* rcb info for sram */
        vdpu34x_set_rcbinfo(dev, hw_ctx->rcb_info);

        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}